

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::DecodeLockingScript::ConvertFromStruct
          (DecodeLockingScript *this,DecodeLockingScriptStruct *data)

{
  DecodeLockingScriptStruct *data_local;
  DecodeLockingScript *this_local;
  
  std::__cxx11::string::operator=((string *)&this->asm__,(string *)data);
  std::__cxx11::string::operator=((string *)&this->hex_,(string *)&data->hex);
  this->req_sigs_ = data->req_sigs;
  std::__cxx11::string::operator=((string *)&this->type_,(string *)&data->type);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertFromStruct(&this->addresses_,&data->addresses);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void DecodeLockingScript::ConvertFromStruct(
    const DecodeLockingScriptStruct& data) {
  asm__ = data.asm_;
  hex_ = data.hex;
  req_sigs_ = data.req_sigs;
  type_ = data.type;
  addresses_.ConvertFromStruct(data.addresses);
  ignore_items = data.ignore_items;
}